

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::verifyLevelsAreEqual
               (DeepImageLevel *level1,DeepImageLevel *level2,int dx,int dy)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Box2i *pBVar5;
  ArgExc *pAVar6;
  ostream *c2;
  string *psVar7;
  ostream *this;
  DeepImageChannel *pDVar8;
  ImageChannel *pIVar9;
  int in_ECX;
  int in_EDX;
  ImageLevel *in_RSI;
  ImageLevel *in_RDI;
  ConstIterator i2;
  ConstIterator i1;
  DeepImageLevel *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  bool local_d1;
  undefined8 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar10;
  DeepImageChannel *in_stack_ffffffffffffffa0;
  
  pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RDI);
  iVar3 = (pBVar5->min).x;
  pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RSI);
  if (iVar3 == (pBVar5->min).x - in_EDX) {
    pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RDI);
    iVar3 = (pBVar5->min).y;
    pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RSI);
    if (iVar3 == (pBVar5->min).y - in_ECX) {
      pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RDI);
      iVar3 = (pBVar5->max).x;
      pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RSI);
      if (iVar3 == (pBVar5->max).x - in_EDX) {
        pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RDI);
        iVar3 = (pBVar5->max).y;
        pBVar5 = Imf_2_5::ImageLevel::dataWindow(in_RSI);
        if (iVar3 == (pBVar5->max).y - in_ECX) {
          Imf_2_5::DeepImageLevel::begin(in_stack_ffffffffffffff18);
          Imf_2_5::DeepImageLevel::begin(in_stack_ffffffffffffff18);
          while( true ) {
            Imf_2_5::DeepImageLevel::end(in_stack_ffffffffffffff18);
            bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffff20,
                                        (ConstIterator *)in_stack_ffffffffffffff18);
            uVar10 = false;
            if (bVar1) {
              Imf_2_5::DeepImageLevel::end(in_stack_ffffffffffffff18);
              uVar10 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffff20,
                                           (ConstIterator *)in_stack_ffffffffffffff18);
            }
            if ((bool)uVar10 == false) {
              Imf_2_5::DeepImageLevel::end(in_stack_ffffffffffffff18);
              bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffff20,
                                          (ConstIterator *)in_stack_ffffffffffffff18);
              local_d1 = true;
              if (!bVar1) {
                Imf_2_5::DeepImageLevel::end(in_stack_ffffffffffffff18);
                local_d1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffff20,
                                               (ConstIterator *)in_stack_ffffffffffffff18);
              }
              if (local_d1 != false) {
                pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar6,"different channel lists");
                __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              return;
            }
            c2 = std::operator<<((ostream *)&std::cout,"            channel ");
            psVar7 = Imf_2_5::DeepImageLevel::ConstIterator::name_abi_cxx11_
                               ((ConstIterator *)0x11e89f);
            this = std::operator<<(c2,(string *)psVar7);
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            psVar7 = Imf_2_5::DeepImageLevel::ConstIterator::name_abi_cxx11_
                               ((ConstIterator *)0x11e8c8);
            Imf_2_5::DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x11e8da);
            bVar1 = std::operator!=(in_stack_ffffffffffffff20,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff18);
            if (bVar1) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar6,"different channel names");
              __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
            }
            pDVar8 = Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11e930);
            iVar3 = (**(pDVar8->super_ImageChannel)._vptr_ImageChannel)();
            pDVar8 = Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11e949);
            iVar4 = (**(pDVar8->super_ImageChannel)._vptr_ImageChannel)();
            if (iVar3 != iVar4) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar6,"different channel types");
              __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
            }
            pIVar9 = &Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11e99e)->
                      super_ImageChannel;
            iVar3 = Imf_2_5::ImageChannel::xSampling(pIVar9);
            pIVar9 = &Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11e9b7)->
                      super_ImageChannel;
            iVar4 = Imf_2_5::ImageChannel::xSampling(pIVar9);
            if (iVar3 != iVar4) break;
            pIVar9 = &Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11e9d6)->
                      super_ImageChannel;
            iVar3 = Imf_2_5::ImageChannel::ySampling(pIVar9);
            pIVar9 = &Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11e9ef)->
                      super_ImageChannel;
            iVar4 = Imf_2_5::ImageChannel::ySampling(pIVar9);
            if (iVar3 != iVar4) break;
            pIVar9 = &Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11ea44)->
                      super_ImageChannel;
            bVar1 = Imf_2_5::ImageChannel::pLinear(pIVar9);
            pIVar9 = &Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11ea62)->
                      super_ImageChannel;
            bVar2 = Imf_2_5::ImageChannel::pLinear(pIVar9);
            if (bVar1 != bVar2) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar6,"different channel types");
              __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
            }
            pDVar8 = Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eabd);
            iVar3 = (**(pDVar8->super_ImageChannel)._vptr_ImageChannel)();
            if (iVar3 == 0) {
              Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eb79);
              Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eb8b);
              verifyPixelsAreEqual<unsigned_int>
                        ((DeepImageChannel *)psVar7,(DeepImageChannel *)c2,
                         (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (int)in_stack_ffffffffffffff80);
            }
            else if (iVar3 == 1) {
              Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eafe);
              Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eb10);
              verifyPixelsAreEqual<half>
                        (in_stack_ffffffffffffffa0,
                         (DeepImageChannel *)CONCAT17(uVar10,in_stack_ffffffffffffff98),
                         (int)((ulong)psVar7 >> 0x20),(int)psVar7);
            }
            else {
              if (iVar3 != 2) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                              ,0x9b,
                              "void (anonymous namespace)::verifyLevelsAreEqual(const DeepImageLevel &, const DeepImageLevel &, int, int)"
                             );
              }
              Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eb3d);
              Imf_2_5::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11eb4f);
              verifyPixelsAreEqual<float>
                        ((DeepImageChannel *)psVar7,(DeepImageChannel *)c2,
                         (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (int)in_stack_ffffffffffffff80);
            }
            Imf_2_5::DeepImageLevel::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff20);
            Imf_2_5::DeepImageLevel::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff20);
          }
          pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar6,"different channel sampling rates");
          __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
      }
    }
  }
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar6,"different data windows");
  __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual
    (const DeepImageLevel &level1,
     const DeepImageLevel &level2,
     int dx,
     int dy)
{
    if (level1.dataWindow().min.x != level2.dataWindow().min.x - dx ||
        level1.dataWindow().min.y != level2.dataWindow().min.y - dy ||
        level1.dataWindow().max.x != level2.dataWindow().max.x - dx ||
        level1.dataWindow().max.y != level2.dataWindow().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    DeepImageLevel::ConstIterator i1 = level1.begin();
    DeepImageLevel::ConstIterator i2 = level2.begin();

    while (i1 != level1.end() && i2 != level2.end())
    {
        cout << "            channel " << i1.name() << endl;

        if (i1.name() != i2.name())
            throw ArgExc ("different channel names");

        if (i1.channel().pixelType() != i2.channel().pixelType())
            throw ArgExc ("different channel types");

        if (i1.channel().xSampling() != i2.channel().xSampling() ||
            i1.channel().ySampling() != i2.channel().ySampling())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel().pLinear() != i2.channel().pLinear())
            throw ArgExc ("different channel types");

        switch (i1.channel().pixelType())
        {
          case HALF:

            verifyPixelsAreEqual <half>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          case FLOAT:

            verifyPixelsAreEqual <float>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          case UINT:

            verifyPixelsAreEqual <unsigned int>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          default:
             assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end() || i2 != level2.end())
        throw ArgExc ("different channel lists");
}